

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
     DeleteHeapBlockList(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *list,
                        Recycler *recycler)

{
  Recycler *recycler_local;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *list_local;
  
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (list,(anon_class_8_1_b8cf05bd)recycler);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::DeleteHeapBlockList(TBlockType * list, Recycler * recycler)
{
    HeapBlockList::ForEachEditing(list, [recycler](TBlockType * heapBlock)
    {
#if DBG
        heapBlock->ReleasePagesShutdown(recycler);
#endif
        TBlockType::Delete(heapBlock);
    });
}